

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O3

bool __thiscall
draco::KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  long lVar1;
  float range;
  byte bVar2;
  byte bVar3;
  char cVar4;
  DataType dt;
  PointAttribute *pPVar5;
  pointer pIVar6;
  long lVar7;
  char *pcVar8;
  pointer piVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int32_t iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  vector<float,_std::allocator<float>_> min_value;
  AttributeQuantizationTransform transform;
  uint32_t local_4a0;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  local_490;
  PointAttributeVectorOutputIterator<unsigned_int> local_478;
  ulong local_438;
  undefined1 local_430 [16];
  pointer local_420;
  int iStack_418;
  uint32_t uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  float fStack_408;
  
  if (0x202 < in_buffer->bitstream_version_) {
    local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar17 = 0;
    while( true ) {
      iVar12 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[6])(this);
      if (iVar12 <= (int)uVar17) break;
      iVar12 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[5])(this,uVar17);
      iVar13 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      lVar20 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var,iVar13) + 8) + 0x10) +
                        (long)iVar12 * 8);
      if (*(int *)(lVar20 + 0x1c) == 9) {
        bVar2 = *(byte *)(lVar20 + 0x18);
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)&local_478,(ulong)bVar2);
        uVar19 = (ulong)((uint)bVar2 * 4);
        if (in_buffer->data_size_ < (long)(in_buffer->pos_ + uVar19)) goto LAB_0013ee6c;
        memcpy(local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,in_buffer->data_ + in_buffer->pos_,uVar19);
        lVar16 = in_buffer->pos_;
        lVar20 = lVar16 + uVar19;
        in_buffer->pos_ = lVar20;
        lVar16 = lVar16 + uVar19 + 4;
        if (in_buffer->data_size_ < lVar16) goto LAB_0013ee6c;
        range = *(float *)(in_buffer->data_ + lVar20);
        in_buffer->pos_ = lVar16;
        if (in_buffer->data_size_ < lVar20 + 5) goto LAB_0013ee6c;
        bVar3 = in_buffer->data_[lVar16];
        in_buffer->pos_ = lVar20 + 5;
        uVar14 = (uint)bVar3;
        if (0x1f < uVar14) goto LAB_0013ee6c;
        local_430._0_8_ = &PTR__AttributeQuantizationTransform_00181ba8;
        local_430._8_4_ = 0xffffffff;
        uStack_410 = 0;
        uStack_40c = 0;
        fStack_408 = 0.0;
        local_420 = (pointer)0x0;
        iStack_418 = 0;
        uStack_414 = 0;
        bVar10 = AttributeQuantizationTransform::SetParameters
                           ((AttributeQuantizationTransform *)local_430,uVar14,
                            (float *)local_478.memory_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(uint)bVar2,range);
        if ((!bVar10) ||
           (bVar10 = AttributeTransform::TransferToAttribute
                               ((AttributeTransform *)local_430,
                                (PointAttribute *)
                                (this->quantized_portable_attributes_).
                                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(int)((ulong)((long)(this->attribute_quantization_transforms_).
                                                                                                          
                                                  super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->attribute_quantization_transforms_).
                                                                                                        
                                                  super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                 -0x55555555]._M_t.
                                super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                ._M_t), !bVar10)) {
          local_430._0_8_ = &PTR__AttributeQuantizationTransform_00181ba8;
          if (local_420 != (pointer)0x0) {
            operator_delete(local_420,CONCAT44(uStack_40c,uStack_410) - (long)local_420);
          }
          goto LAB_0013ee6c;
        }
        std::
        vector<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
        ::push_back(&this->attribute_quantization_transforms_,
                    (AttributeQuantizationTransform *)local_430);
        local_430._0_8_ = &PTR__AttributeQuantizationTransform_00181ba8;
        if (local_420 != (pointer)0x0) {
          operator_delete(local_420,CONCAT44(uStack_40c,uStack_410) - (long)local_420);
        }
      }
      uVar17 = (ulong)((int)uVar17 + 1);
    }
    bVar10 = true;
    if ((this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar17 = 0;
      do {
        bVar11 = anon_unknown_46::DecodeVarintUnsigned<unsigned_int>(1,(uint *)local_430,in_buffer);
        if (!bVar11) goto LAB_0013ee6c;
        piVar9 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9[uVar17] = -(local_430._0_4_ & 1) ^ (uint)local_430._0_4_ >> 1;
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)(this->min_signed_values_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
    }
    goto LAB_0013ee6e;
  }
  uVar14 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[6])(this);
  uVar17 = (ulong)uVar14;
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(&local_490,uVar17,(allocator_type *)local_430);
  if (uVar17 == 0) {
    local_4a0 = 0;
  }
  else {
    lVar20 = 0x10;
    uVar19 = 0;
    local_4a0 = 0;
    do {
      iVar12 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[5])(this,uVar19 & 0xffffffff);
      iVar13 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      lVar16 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar13) + 8) + 0x10) +
                        (long)iVar12 * 8);
      dt = *(DataType *)(lVar16 + 0x1c);
      iVar15 = DataTypeLength(dt);
      if (4 < iVar15) goto LAB_0013ee8b;
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      bVar2 = *(byte *)(lVar16 + 0x18);
      *(long *)((long)&((local_490.
                         super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       ).
                       super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                       super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
                       super__Tuple_impl<4UL,_unsigned_int>.
                       super__Head_base<4UL,_unsigned_int,_false>._M_head_impl + lVar20) = lVar16;
      *(uint32_t *)
       ((long)local_490.
              super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar20 + -4) = local_4a0;
      *(DataType *)
       ((long)&local_490.
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + lVar20) = dt;
      *(int32_t *)
       ((long)&local_490.
               super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
               .super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>.
               super__Head_base<1UL,_unsigned_int,_false>._M_head_impl + lVar20) = iVar15;
      *(uint *)((long)&local_490.
                       super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       .
                       super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                       .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                       super__Head_base<2UL,_draco::DataType,_false>._M_head_impl + lVar20) =
           (uint)bVar2;
      local_4a0 = local_4a0 + bVar2;
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x18;
    } while (uVar17 != uVar19);
  }
  iVar12 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[5])(this,0);
  iVar13 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
             _vptr_AttributesDecoderInterface[7])(this);
  pPVar5 = *(PointAttribute **)
            (*(long *)(*(long *)(CONCAT44(extraout_var_01,iVar13) + 8) + 0x10) + (long)iVar12 * 8);
  pPVar5->identity_mapping_ = true;
  pIVar6 = (pPVar5->indices_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar5->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
    (pPVar5->indices_map_).vector_.
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
  }
  lVar16 = in_buffer->data_size_;
  lVar7 = in_buffer->pos_;
  lVar20 = lVar7 + 1;
  if (lVar16 < lVar20) goto LAB_0013ee8b;
  pcVar8 = in_buffer->data_;
  cVar4 = pcVar8[lVar7];
  in_buffer->pos_ = lVar20;
  if (cVar4 == '\x01') {
    lVar1 = lVar7 + 2;
    if (lVar16 < lVar1) goto LAB_0013ee8b;
    bVar2 = pcVar8[lVar20];
    in_buffer->pos_ = lVar1;
    if (6 < bVar2) {
      bVar10 = false;
      printf("KdTreeAttributesDecoder: compression level %i not supported.\n");
      goto LAB_0013ee92;
    }
    if (lVar16 < lVar7 + 6) goto LAB_0013ee8b;
    local_438 = (ulong)*(uint *)(pcVar8 + lVar1);
    in_buffer->pos_ = lVar7 + 6;
    if (uVar17 != 0) {
      uVar18 = 0;
      do {
        iVar12 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[5])(this,(ulong)uVar18);
        iVar13 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                   _vptr_AttributesDecoderInterface[7])(this);
        pPVar5 = *(PointAttribute **)
                  (*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar13) + 8) + 0x10) +
                  (long)iVar12 * 8);
        PointAttribute::Reset(pPVar5,local_438);
        pPVar5->identity_mapping_ = true;
        pIVar6 = (pPVar5->indices_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pPVar5->indices_map_).vector_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
          (pPVar5->indices_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
        }
        uVar18 = uVar18 + 1;
      } while (uVar14 != uVar18);
    }
    PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
              (&local_478,&local_490);
    switch(bVar2) {
    case 0:
      DynamicIntegerPointsKdTreeDecoder<0>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<0> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<0>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<0> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<0>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<0> *)local_430);
      break;
    case 1:
      DynamicIntegerPointsKdTreeDecoder<1>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<1> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<1>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<1> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<1>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<1> *)local_430);
      break;
    case 2:
      DynamicIntegerPointsKdTreeDecoder<2>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<2> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<2>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<2> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<2>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<2> *)local_430);
      break;
    case 3:
      DynamicIntegerPointsKdTreeDecoder<3>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<3> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<3>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<3> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<3>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<3> *)local_430);
      break;
    case 4:
      DynamicIntegerPointsKdTreeDecoder<4>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<4> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<4>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<4> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<4>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<4> *)local_430);
      break;
    case 5:
      DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<5> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<5>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<5> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<5> *)local_430);
      break;
    case 6:
      DynamicIntegerPointsKdTreeDecoder<6>::DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<6> *)local_430,local_4a0);
      bVar10 = DynamicIntegerPointsKdTreeDecoder<6>::
               DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                         ((DynamicIntegerPointsKdTreeDecoder<6> *)local_430,in_buffer,&local_478,
                          0xffffffff);
      DynamicIntegerPointsKdTreeDecoder<6>::~DynamicIntegerPointsKdTreeDecoder
                ((DynamicIntegerPointsKdTreeDecoder<6> *)local_430);
      break;
    default:
      goto switchD_0013ef7b_default;
    }
    if (bVar10 == false) {
switchD_0013ef7b_default:
      PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
                (&local_478);
LAB_0013ee8b:
      bVar10 = false;
    }
    else {
      PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator
                (&local_478);
LAB_0013f0fa:
      bVar10 = true;
    }
  }
  else {
    if (cVar4 != '\0') goto LAB_0013ee8b;
    if ((long)local_490.
              super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_490.
              super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18) {
      if (((uint)((local_490.
                   super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                 ).super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                 .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int>.
                 super__Tuple_impl<3UL,_unsigned_int,_unsigned_int>.
                 super__Tuple_impl<4UL,_unsigned_int>.super__Head_base<4UL,_unsigned_int,_false> !=
           3) || (lVar20 = lVar7 + 2, lVar16 < lVar20)) goto LAB_0013ee8b;
      in_buffer->pos_ = lVar20;
      if (lVar16 < lVar7 + 6) goto LAB_0013ee8b;
      uVar14 = *(uint *)(pcVar8 + lVar20);
      in_buffer->pos_ = lVar7 + 6;
      PointAttribute::Reset(pPVar5,(ulong)uVar14);
      FloatPointsTreeDecoder::FloatPointsTreeDecoder((FloatPointsTreeDecoder *)&local_478);
      local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(uVar14,local_478.memory_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      PointAttributeVectorOutputIterator<float>::PointAttributeVectorOutputIterator
                ((PointAttributeVectorOutputIterator<float> *)local_430,&local_490);
      bVar10 = FloatPointsTreeDecoder::
               DecodePointCloud<draco::PointAttributeVectorOutputIterator<float>>
                         ((FloatPointsTreeDecoder *)&local_478,in_buffer,
                          (PointAttributeVectorOutputIterator<float> *)local_430);
      PointAttributeVectorOutputIterator<float>::~PointAttributeVectorOutputIterator
                ((PointAttributeVectorOutputIterator<float> *)local_430);
      if (!bVar10) goto LAB_0013ee8b;
      goto LAB_0013f0fa;
    }
    bVar10 = false;
  }
LAB_0013ee92:
  if (local_490.
      super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return bVar10;
  }
  uVar17 = (long)local_490.
                 super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)local_490.
                 super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_0013eea2:
  operator_delete(local_490.
                  super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,uVar17);
  return bVar10;
LAB_0013ee6c:
  bVar10 = false;
LAB_0013ee6e:
  if ((pointer)local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return bVar10;
  }
  uVar17 = (long)local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_490.
  super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_478.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  goto LAB_0013eea2;
}

Assistant:

bool KdTreeAttributesDecoder::DecodeDataNeededByPortableTransforms(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 3)) {
    // Decode quantization data for each attribute that need it.
    // TODO(ostava): This should be moved to AttributeQuantizationTransform.
    std::vector<float> min_value;
    for (int i = 0; i < GetNumAttributes(); ++i) {
      const int att_id = GetAttributeId(i);
      const PointAttribute *const att =
          GetDecoder()->point_cloud()->attribute(att_id);
      if (att->data_type() == DT_FLOAT32) {
        const int num_components = att->num_components();
        min_value.resize(num_components);
        if (!in_buffer->Decode(&min_value[0], sizeof(float) * num_components)) {
          return false;
        }
        float max_value_dif;
        if (!in_buffer->Decode(&max_value_dif)) {
          return false;
        }
        uint8_t quantization_bits;
        if (!in_buffer->Decode(&quantization_bits) || quantization_bits > 31) {
          return false;
        }
        AttributeQuantizationTransform transform;
        if (!transform.SetParameters(quantization_bits, min_value.data(),
                                     num_components, max_value_dif)) {
          return false;
        }
        const int num_transforms =
            static_cast<int>(attribute_quantization_transforms_.size());
        if (!transform.TransferToAttribute(
                quantized_portable_attributes_[num_transforms].get())) {
          return false;
        }
        attribute_quantization_transforms_.push_back(transform);
      }
    }

    // Decode transform data for signed integer attributes.
    for (int i = 0; i < min_signed_values_.size(); ++i) {
      int32_t val;
      if (!DecodeVarint(&val, in_buffer)) {
        return false;
      }
      min_signed_values_[i] = val;
    }
    return true;
  }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  // Handle old bitstream
  // Figure out the total dimensionality of the point cloud
  const uint32_t attribute_count = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(attribute_count);
  for (auto attribute_index = 0;
       static_cast<uint32_t>(attribute_index) < attribute_count;
       attribute_index += 1)  // increment the dimensionality as needed...
  {
    const int att_id = GetAttributeId(attribute_index);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    const DataType data_type = att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = att->num_components();
    if (data_size > 4) {
      return false;
    }

    atts[attribute_index] = std::make_tuple(
        att, total_dimensionality, data_type, data_size, num_components);
    // everything is treated as 32bit in the encoder.
    total_dimensionality += num_components;
  }

  const int att_id = GetAttributeId(0);
  PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
  att->SetIdentityMapping();
  // Decode method
  uint8_t method;
  if (!in_buffer->Decode(&method)) {
    return false;
  }
  if (method == KdTreeAttributesEncodingMethod::kKdTreeQuantizationEncoding) {
    // This method only supports one attribute with exactly three components.
    if (atts.size() != 1 || std::get<4>(atts[0]) != 3) {
      return false;
    }
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    uint32_t num_points = 0;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }
    att->Reset(num_points);
    FloatPointsTreeDecoder decoder;
    decoder.set_num_points_from_header(num_points);
    PointAttributeVectorOutputIterator<float> out_it(atts);
    if (!decoder.DecodePointCloud(in_buffer, out_it)) {
      return false;
    }
  } else if (method == KdTreeAttributesEncodingMethod::kKdTreeIntegerEncoding) {
    uint8_t compression_level = 0;
    if (!in_buffer->Decode(&compression_level)) {
      return false;
    }
    if (6 < compression_level) {
      DRACO_LOGE(
          "KdTreeAttributesDecoder: compression level %i not supported.\n",
          compression_level);
      return false;
    }

    uint32_t num_points;
    if (!in_buffer->Decode(&num_points)) {
      return false;
    }

    for (auto attribute_index = 0;
         static_cast<uint32_t>(attribute_index) < attribute_count;
         attribute_index += 1) {
      const int att_id = GetAttributeId(attribute_index);
      PointAttribute *const attr =
          GetDecoder()->point_cloud()->attribute(att_id);
      attr->Reset(num_points);
      attr->SetIdentityMapping();
    }

    PointAttributeVectorOutputIterator<uint32_t> out_it(atts);

    switch (compression_level) {
      case 0: {
        DynamicIntegerPointsKdTreeDecoder<0> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 1: {
        DynamicIntegerPointsKdTreeDecoder<1> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 2: {
        DynamicIntegerPointsKdTreeDecoder<2> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 3: {
        DynamicIntegerPointsKdTreeDecoder<3> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 4: {
        DynamicIntegerPointsKdTreeDecoder<4> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 5: {
        DynamicIntegerPointsKdTreeDecoder<5> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      case 6: {
        DynamicIntegerPointsKdTreeDecoder<6> decoder(total_dimensionality);
        if (!decoder.DecodePoints(in_buffer, out_it)) {
          return false;
        }
        break;
      }
      default:
        return false;
    }
  } else {
    // Invalid method.
    return false;
  }
  return true;
#else
  return false;
#endif
}